

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

void t1_builder_init(T1_Builder builder,FT_Face face,FT_Size size,FT_GlyphSlot_conflict glyph,
                    FT_Bool hinting)

{
  FT_GlyphLoader loader_00;
  FT_GlyphLoader loader;
  FT_Bool hinting_local;
  FT_GlyphSlot_conflict glyph_local;
  FT_Size size_local;
  FT_Face face_local;
  T1_Builder builder_local;
  
  builder->parse_state = T1_Parse_Start;
  builder->load_points = '\x01';
  builder->face = face;
  builder->glyph = glyph;
  builder->memory = face->memory;
  if (glyph != (FT_GlyphSlot_conflict)0x0) {
    loader_00 = glyph->internal->loader;
    builder->loader = loader_00;
    builder->base = &(loader_00->base).outline;
    builder->current = &(loader_00->current).outline;
    FT_GlyphLoader_Rewind(loader_00);
    builder->hints_globals = size->internal->module_data;
    builder->hints_funcs = (void *)0x0;
    if (hinting != '\0') {
      builder->hints_funcs = glyph->internal->glyph_hints;
    }
  }
  builder->pos_x = 0;
  builder->pos_y = 0;
  (builder->left_bearing).x = 0;
  (builder->left_bearing).y = 0;
  (builder->advance).x = 0;
  (builder->advance).y = 0;
  memcpy(&builder->funcs,&t1_builder_funcs,0x40);
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  t1_builder_init( T1_Builder    builder,
                   FT_Face       face,
                   FT_Size       size,
                   FT_GlyphSlot  glyph,
                   FT_Bool       hinting )
  {
    builder->parse_state = T1_Parse_Start;
    builder->load_points = 1;

    builder->face   = face;
    builder->glyph  = glyph;
    builder->memory = face->memory;

    if ( glyph )
    {
      FT_GlyphLoader  loader = glyph->internal->loader;


      builder->loader  = loader;
      builder->base    = &loader->base.outline;
      builder->current = &loader->current.outline;
      FT_GlyphLoader_Rewind( loader );

      builder->hints_globals = size->internal->module_data;
      builder->hints_funcs   = NULL;

      if ( hinting )
        builder->hints_funcs = glyph->internal->glyph_hints;
    }

    builder->pos_x = 0;
    builder->pos_y = 0;

    builder->left_bearing.x = 0;
    builder->left_bearing.y = 0;
    builder->advance.x      = 0;
    builder->advance.y      = 0;

    builder->funcs = t1_builder_funcs;
  }